

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.c
# Opt level: O2

bool check_playing(DESCRIPTOR_DATA *d,char *name)

{
  bool bVar1;
  CHAR_DATA *pCVar2;
  DESCRIPTOR_DATA **ppDVar3;
  
  ppDVar3 = &descriptor_list;
  do {
    do {
      ppDVar3 = &((DESCRIPTOR_DATA *)ppDVar3)->next->next;
      if ((DESCRIPTOR_DATA *)ppDVar3 == (DESCRIPTOR_DATA *)0x0) goto LAB_002d7c56;
    } while ((((DESCRIPTOR_DATA *)ppDVar3 == d) ||
             (((DESCRIPTOR_DATA *)ppDVar3)->character == (CHAR_DATA *)0x0)) ||
            ((ushort)(((DESCRIPTOR_DATA *)ppDVar3)->connected - 1U) < 2));
    pCVar2 = ((DESCRIPTOR_DATA *)ppDVar3)->character;
    if (((DESCRIPTOR_DATA *)ppDVar3)->original != (CHAR_DATA *)0x0) {
      pCVar2 = ((DESCRIPTOR_DATA *)ppDVar3)->original;
    }
    bVar1 = str_cmp(name,pCVar2->true_name);
  } while (bVar1);
  write_to_buffer(d,"That character is already playing.\n\r",0);
  write_to_buffer(d,"Do you wish to connect anyway (Y/N)?",0);
  d->connected = 0x11;
LAB_002d7c56:
  return (DESCRIPTOR_DATA *)ppDVar3 != (DESCRIPTOR_DATA *)0x0;
}

Assistant:

bool check_playing(DESCRIPTOR_DATA *d, char *name)
{
	DESCRIPTOR_DATA *dold;

	for (dold = descriptor_list; dold; dold = dold->next)
	{
		if (dold != d
			&& dold->character != nullptr
			&& dold->connected != CON_GET_NAME
			&& dold->connected != CON_GET_OLD_PASSWORD
			&& !str_cmp(name, dold->original ? dold->original->true_name : dold->character->true_name))
		{
			write_to_buffer(d, "That character is already playing.\n\r", 0);
			write_to_buffer(d, "Do you wish to connect anyway (Y/N)?", 0);

			d->connected = CON_BREAK_CONNECT;
			return true;
		}
	}

	return false;
}